

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reactive_socket_send_op.hpp
# Opt level: O0

status webfront::http::std::experimental::net::v1::detail::
       reactive_socket_send_op_base<std::experimental::net::v1::detail::prepared_buffers<std::experimental::net::v1::const_buffer,_64UL>_>
       ::do_perform(reactor_op *base)

{
  ulong uVar1;
  bool bVar2;
  size_t sVar3;
  long in_RDI;
  status result;
  buffer_sequence_adapter<std::experimental::net::v1::const_buffer,_std::experimental::net::v1::detail::prepared_buffers<std::experimental::net::v1::const_buffer,_64UL>_>
  bufs;
  reactive_socket_send_op_base<std::experimental::net::v1::detail::prepared_buffers<std::experimental::net::v1::const_buffer,_64UL>_>
  *o;
  undefined4 in_stack_fffffffffffffbc8;
  undefined4 in_stack_fffffffffffffbcc;
  buffer_sequence_adapter<std::experimental::net::v1::const_buffer,_std::experimental::net::v1::detail::prepared_buffers<std::experimental::net::v1::const_buffer,_64UL>_>
  *in_stack_fffffffffffffbd0;
  status local_424;
  size_t *in_stack_fffffffffffffc18;
  error_code *in_stack_fffffffffffffc20;
  int in_stack_fffffffffffffc2c;
  void *in_stack_fffffffffffffc30;
  buf *in_stack_fffffffffffffc38;
  socket_type in_stack_fffffffffffffc40;
  
  buffer_sequence_adapter<std::experimental::net::v1::const_buffer,_std::experimental::net::v1::detail::prepared_buffers<std::experimental::net::v1::const_buffer,_64UL>_>
  ::buffer_sequence_adapter
            (in_stack_fffffffffffffbd0,
             (prepared_buffers<std::experimental::net::v1::const_buffer,_64UL> *)
             CONCAT44(in_stack_fffffffffffffbcc,in_stack_fffffffffffffbc8));
  buffer_sequence_adapter<std::experimental::net::v1::const_buffer,_std::experimental::net::v1::detail::prepared_buffers<std::experimental::net::v1::const_buffer,_64UL>_>
  ::buffers((buffer_sequence_adapter<std::experimental::net::v1::const_buffer,_std::experimental::net::v1::detail::prepared_buffers<std::experimental::net::v1::const_buffer,_64UL>_>
             *)&stack0xfffffffffffffbe0);
  buffer_sequence_adapter<std::experimental::net::v1::const_buffer,_std::experimental::net::v1::detail::prepared_buffers<std::experimental::net::v1::const_buffer,_64UL>_>
  ::count((buffer_sequence_adapter<std::experimental::net::v1::const_buffer,_std::experimental::net::v1::detail::prepared_buffers<std::experimental::net::v1::const_buffer,_64UL>_>
           *)&stack0xfffffffffffffbe0);
  bVar2 = socket_ops::non_blocking_send
                    (in_stack_fffffffffffffc40,in_stack_fffffffffffffc38,
                     (size_t)in_stack_fffffffffffffc30,in_stack_fffffffffffffc2c,
                     in_stack_fffffffffffffc20,in_stack_fffffffffffffc18);
  local_424 = (status)bVar2;
  if (((local_424 == done) && ((*(byte *)(in_RDI + 0x3c) & 0x10) != 0)) &&
     (uVar1 = *(ulong *)(in_RDI + 0x28),
     sVar3 = buffer_sequence_adapter<std::experimental::net::v1::const_buffer,_std::experimental::net::v1::detail::prepared_buffers<std::experimental::net::v1::const_buffer,_64UL>_>
             ::total_size((buffer_sequence_adapter<std::experimental::net::v1::const_buffer,_std::experimental::net::v1::detail::prepared_buffers<std::experimental::net::v1::const_buffer,_64UL>_>
                           *)&stack0xfffffffffffffbe0), uVar1 < sVar3)) {
    local_424 = done_and_exhausted;
  }
  return local_424;
}

Assistant:

static status do_perform(reactor_op* base)
  {
    reactive_socket_send_op_base* o(
        static_cast<reactive_socket_send_op_base*>(base));

    buffer_sequence_adapter<std::experimental::net::v1::const_buffer,
        ConstBufferSequence> bufs(o->buffers_);

    status result = socket_ops::non_blocking_send(o->socket_,
          bufs.buffers(), bufs.count(), o->flags_,
          o->ec_, o->bytes_transferred_) ? done : not_done;

    if (result == done)
      if ((o->state_ & socket_ops::stream_oriented) != 0)
        if (o->bytes_transferred_ < bufs.total_size())
          result = done_and_exhausted;

    NET_TS_HANDLER_REACTOR_OPERATION((*o, "non_blocking_send",
          o->ec_, o->bytes_transferred_));

    return result;
  }